

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O0

bool __thiscall MipsMacroCommand::Validate(MipsMacroCommand *this,ValidateState *state)

{
  bool bVar1;
  int iVar2;
  int64_t iVar3;
  pointer pCVar4;
  int64_t iVar5;
  int64_t newMemoryPos;
  bool result;
  int64_t memoryPos;
  ValidateState *state_local;
  MipsMacroCommand *this_local;
  
  iVar3 = FileManager::getVirtualAddress(g_fileManager);
  pCVar4 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator->
                     (&this->content);
  CAssemblerCommand::applyFileInfo(pCVar4);
  pCVar4 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator->
                     (&this->content);
  iVar2 = (*pCVar4->_vptr_CAssemblerCommand[2])(pCVar4,state);
  iVar5 = FileManager::getVirtualAddress(g_fileManager);
  CAssemblerCommand::applyFileInfo(&this->super_CAssemblerCommand);
  if (((((this->IgnoreLoadDelay & 1U) == 0) &&
       (bVar1 = CMipsArchitecture::GetDelaySlot(&Mips), bVar1)) && (4 < iVar5 - iVar3)) &&
     ((this->macroFlags & 0x2000U) == 0)) {
    Logger::queueError<>(Warning,"Macro with multiple opcodes used inside a delay slot");
  }
  if (iVar5 == iVar3) {
    Logger::queueError<>(Warning,"Empty macro content");
  }
  return (bool)((byte)iVar2 & 1);
}

Assistant:

bool MipsMacroCommand::Validate(const ValidateState &state)
{
	int64_t memoryPos = g_fileManager->getVirtualAddress();
	content->applyFileInfo();
	bool result = content->Validate(state);
	int64_t newMemoryPos = g_fileManager->getVirtualAddress();

	applyFileInfo();

	if (!IgnoreLoadDelay && Mips.GetDelaySlot() && (newMemoryPos-memoryPos) > 4
		&& (macroFlags & MIPSM_DONTWARNDELAYSLOT) == 0)
	{
		Logger::queueError(Logger::Warning, "Macro with multiple opcodes used inside a delay slot");
	}

	if (newMemoryPos == memoryPos)
		Logger::queueError(Logger::Warning, "Empty macro content");

	return result;
}